

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O3

void test_chain_boundary_insertion<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>>
               (Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>
                *m1,Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>
                    *m2)

{
  Column_container *this;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  *boundary;
  ID_index IVar1;
  pointer ppVar2;
  pointer ppVar3;
  uint dimension;
  Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>
  *pMVar4;
  pointer pvVar5;
  const_iterator cVar6;
  long *plVar7;
  iterator iVar8;
  logic_error *plVar9;
  ulong uVar10;
  long *plVar11;
  ulong uVar12;
  uint uVar13;
  Underlying_matrix *this_00;
  anon_class_1_0_00000001 test;
  undefined4 local_368;
  int local_364;
  undefined **local_360;
  ulong local_358;
  shared_count sStack_350;
  undefined4 ***local_348;
  undefined **local_340;
  undefined1 local_338;
  undefined8 *local_330;
  pair<unsigned_int,_unsigned_int> *local_328;
  undefined4 *local_320;
  pair<unsigned_int,_unsigned_int> local_318;
  Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>
  *local_310;
  undefined **local_308;
  char *local_300;
  undefined8 *local_2f8;
  char *local_2f0;
  undefined1 local_2e8 [8];
  undefined8 local_2e0;
  shared_count sStack_2d8;
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  orderedBoundaries;
  value_type boundary1;
  value_type boundary2;
  undefined4 **local_288;
  char *local_280;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_278;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_260;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_248;
  undefined1 *local_230;
  undefined1 *local_228;
  char *local_220;
  char *local_218;
  undefined1 *local_210;
  undefined1 *local_208;
  char *local_200;
  char *local_1f8;
  undefined1 *local_1f0;
  undefined1 *local_1e8;
  char *local_1e0;
  char *local_1d8;
  char *local_1d0;
  char *local_1c8;
  undefined1 *local_1c0;
  undefined1 *local_1b8;
  char *local_1b0;
  char *local_1a8;
  char *local_1a0;
  char *local_198;
  undefined1 *local_190;
  undefined1 *local_188;
  char *local_180;
  char *local_178;
  char *local_170;
  char *local_168;
  undefined1 *local_160;
  undefined1 *local_158;
  char *local_150;
  char *local_148;
  char *local_140;
  char *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  char *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  undefined1 *local_a0;
  undefined1 *local_98;
  char *local_90;
  char *local_88;
  char *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  local_310 = m2;
  build_simple_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>>>
            ();
  if (orderedBoundaries.
      super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      orderedBoundaries.
      super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar13 = 1;
    uVar10 = 0;
    do {
      if ((m1->colSettings_->operators).characteristic_ == 0xffffffff) {
        plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error
                  (plVar9,
                   "Matrix::insert_boundary - Columns cannot be initialized if the coefficient field characteristic is not specified."
                  );
        __cxa_throw(plVar9,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      boundary = orderedBoundaries.
                 super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar10;
      ppVar2 = (boundary->
               super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      ppVar3 = (boundary->
               super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      dimension = (int)((ulong)((long)ppVar2 - (long)ppVar3) >> 3) - 1;
      if (ppVar2 == ppVar3) {
        dimension = 0;
      }
      Gudhi::persistence_matrix::Matrix_all_dimension_holder<int>::update_up
                (&(m1->matrix_).super_Matrix_dimension_option,dimension);
      Gudhi::persistence_matrix::
      Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>>
      ::
      _reduce_boundary<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
                (&local_248,
                 (Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>>
                  *)&m1->matrix_,uVar13 - 1,boundary,-1);
      if (local_248.
          super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_248.
                        super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_248.
                              super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_248.
                              super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      uVar10 = (ulong)uVar13;
      uVar12 = ((long)orderedBoundaries.
                      super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)orderedBoundaries.
                      super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      uVar13 = uVar13 + 1;
    } while (uVar10 <= uVar12 && uVar12 - uVar10 != 0);
  }
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x220);
  local_300 = (char *)((ulong)local_300 & 0xffffffffffffff00);
  local_308 = &PTR__lazy_ostream_00242048;
  local_2f8 = &boost::unit_test::lazy_ostream::inst;
  local_2f0 = "";
  local_318.first = (uint)(m1->matrix_).matrix_._M_h._M_element_count;
  boundary1.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = &local_318;
  local_288 = &local_320;
  local_320 = (undefined4 *)CONCAT44(local_320._4_4_,7);
  local_2e8[0] = local_318.first == 7;
  local_2e0 = 0;
  sStack_2d8.pi_ = (sp_counted_base *)0x0;
  local_328 = (pair<unsigned_int,_unsigned_int> *)&boundary1;
  local_338 = 0;
  local_340 = &PTR__lazy_ostream_00241fb8;
  local_330 = &boost::unit_test::lazy_ostream::inst;
  local_348 = &local_288;
  local_358 = local_358 & 0xffffffffffffff00;
  local_360 = &PTR__lazy_ostream_00242008;
  sStack_350.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  boundary2.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_a5a55;
  boundary2.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x1fb5c7;
  boost::test_tools::tt_detail::report_assertion
            (local_2e8,&local_308,&boundary2,0x220,1,2,2,"m1.get_number_of_columns()",&local_340,"7"
             ,&local_360);
  boost::detail::shared_count::~shared_count(&sStack_2d8);
  test_chain_boundary_insertion<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>
  ::anon_class_1_0_00000001::operator()(&test,m1);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector(&boundary2,
           orderedBoundaries.
           super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + -1);
  ppVar2 = orderedBoundaries.
           super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1].
           super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar5 = orderedBoundaries.
           super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + -1;
  if (ppVar2 != (pointer)0x0) {
    pvVar5 = orderedBoundaries.
             super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1;
    orderedBoundaries.
    super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         orderedBoundaries.
         super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + -1;
    operator_delete(ppVar2,(long)(pvVar5->
                                 super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                 )._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppVar2)
    ;
    pvVar5 = orderedBoundaries.
             super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  orderedBoundaries.
  super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pvVar5;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector(&boundary1,
           orderedBoundaries.
           super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + -1);
  ppVar2 = orderedBoundaries.
           super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1].
           super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar5 = orderedBoundaries.
           super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + -1;
  if (ppVar2 != (pointer)0x0) {
    pvVar5 = orderedBoundaries.
             super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1;
    orderedBoundaries.
    super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         orderedBoundaries.
         super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + -1;
    operator_delete(ppVar2,(long)(pvVar5->
                                 super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                 )._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppVar2)
    ;
    pvVar5 = orderedBoundaries.
             super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  orderedBoundaries.
  super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pvVar5;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0x228);
  local_340 = (undefined **)CONCAT44(local_340._4_4_,1);
  this = &(local_310->matrix_).matrix_;
  cVar6 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&this->_M_h,(key_type *)&local_340);
  if (cVar6.
      super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    std::__throw_out_of_range("_Map_base::at");
  }
  plVar7 = (long *)((long)cVar6.
                          super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>_>,_false>
                          ._M_cur + 0x30);
  plVar11 = plVar7;
  do {
    plVar11 = (long *)*plVar11;
    if (plVar11 == plVar7) break;
  } while (*(int *)(plVar11 + 2) != 2);
  local_358 = 0;
  sStack_350.pi_ = (sp_counted_base *)0x0;
  local_308 = (undefined **)0x202cd6;
  local_300 = "";
  local_338 = 0;
  local_340 = &PTR__lazy_ostream_00242248;
  local_330 = &boost::unit_test::lazy_ostream::inst;
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_78 = "";
  local_328 = (pair<unsigned_int,_unsigned_int> *)&local_308;
  local_360._0_1_ = plVar11 == plVar7;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_350);
  local_90 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_88 = "";
  local_a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_98 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_90,0x229);
  local_340 = (undefined **)CONCAT44(local_340._4_4_,1);
  cVar6 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&this->_M_h,(key_type *)&local_340);
  if (cVar6.
      super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    std::__throw_out_of_range("_Map_base::at");
  }
  plVar7 = (long *)((long)cVar6.
                          super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>_>,_false>
                          ._M_cur + 0x30);
  plVar11 = plVar7;
  do {
    plVar11 = (long *)*plVar11;
    if (plVar11 == plVar7) break;
  } while (*(int *)(plVar11 + 2) != 1);
  local_360._0_1_ = plVar11 != plVar7;
  local_358 = 0;
  sStack_350.pi_ = (sp_counted_base *)0x0;
  local_308 = (undefined **)0x202ced;
  local_300 = "";
  local_338 = 0;
  local_340 = &PTR__lazy_ostream_00242248;
  local_330 = &boost::unit_test::lazy_ostream::inst;
  local_b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_a8 = "";
  local_328 = (pair<unsigned_int,_unsigned_int> *)&local_308;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_350);
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_b8 = "";
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_c0,0x22a);
  local_340 = (undefined **)CONCAT44(local_340._4_4_,3);
  cVar6 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&this->_M_h,(key_type *)&local_340);
  if (cVar6.
      super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    std::__throw_out_of_range("_Map_base::at");
  }
  plVar7 = (long *)((long)cVar6.
                          super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>_>,_false>
                          ._M_cur + 0x30);
  plVar11 = plVar7;
  do {
    plVar11 = (long *)*plVar11;
    if (plVar11 == plVar7) break;
  } while (*(int *)(plVar11 + 2) != 3);
  local_360._0_1_ = plVar11 != plVar7;
  local_358 = 0;
  sStack_350.pi_ = (sp_counted_base *)0x0;
  local_308 = (undefined **)0x202d05;
  local_300 = "";
  local_338 = 0;
  local_340 = &PTR__lazy_ostream_00242248;
  local_330 = &boost::unit_test::lazy_ostream::inst;
  local_e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_d8 = "";
  local_328 = (pair<unsigned_int,_unsigned_int> *)&local_308;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_350);
  local_f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_e8 = "";
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_f0,0x22b);
  local_340 = (undefined **)((ulong)local_340 & 0xffffffff00000000);
  iVar8 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&this->_M_h,(key_type *)&local_340);
  if (iVar8.
      super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    std::__throw_out_of_range("_Map_base::at");
  }
  local_360._0_1_ =
       *(long *)((long)iVar8.
                       super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>_>,_false>
                       ._M_cur + 0x30) !=
       (long)iVar8.
             super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>_>,_false>
             ._M_cur + 0x30 &&
       *(long *)((long)iVar8.
                       super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>_>,_false>
                       ._M_cur + 0x30) != 0;
  local_358 = 0;
  sStack_350.pi_ = (sp_counted_base *)0x0;
  local_308 = (undefined **)0x202d1d;
  local_300 = "";
  local_338 = 0;
  local_340 = &PTR__lazy_ostream_00242248;
  local_330 = &boost::unit_test::lazy_ostream::inst;
  local_110 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_108 = "";
  local_328 = (pair<unsigned_int,_unsigned_int> *)&local_308;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_350);
  local_120 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_118 = "";
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_120,0x22c);
  local_340 = (undefined **)CONCAT44(local_340._4_4_,1);
  iVar8 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&this->_M_h,(key_type *)&local_340);
  if (iVar8.
      super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    std::__throw_out_of_range("_Map_base::at");
  }
  local_360._0_1_ =
       *(long *)((long)iVar8.
                       super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>_>,_false>
                       ._M_cur + 0x30) !=
       (long)iVar8.
             super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>_>,_false>
             ._M_cur + 0x30 &&
       *(long *)((long)iVar8.
                       super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>_>,_false>
                       ._M_cur + 0x30) != 0;
  local_358 = 0;
  sStack_350.pi_ = (sp_counted_base *)0x0;
  local_308 = (undefined **)0x202d33;
  local_300 = "";
  local_338 = 0;
  local_340 = &PTR__lazy_ostream_00242248;
  local_330 = &boost::unit_test::lazy_ostream::inst;
  local_140 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_138 = "";
  local_328 = (pair<unsigned_int,_unsigned_int> *)&local_308;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_350);
  local_150 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_148 = "";
  local_160 = &boost::unit_test::basic_cstring<char_const>::null;
  local_158 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_150,0x22d);
  local_340 = (undefined **)CONCAT44(local_340._4_4_,2);
  iVar8 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&this->_M_h,(key_type *)&local_340);
  if (iVar8.
      super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    std::__throw_out_of_range("_Map_base::at");
  }
  local_360._0_1_ =
       *(long *)((long)iVar8.
                       super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>_>,_false>
                       ._M_cur + 0x30) !=
       (long)iVar8.
             super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>_>,_false>
             ._M_cur + 0x30 &&
       *(long *)((long)iVar8.
                       super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>_>,_false>
                       ._M_cur + 0x30) != 0;
  local_358 = 0;
  sStack_350.pi_ = (sp_counted_base *)0x0;
  local_308 = (undefined **)0x202d49;
  local_300 = "";
  local_338 = 0;
  local_340 = &PTR__lazy_ostream_00242248;
  local_330 = &boost::unit_test::lazy_ostream::inst;
  local_170 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_168 = "";
  local_328 = (pair<unsigned_int,_unsigned_int> *)&local_308;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_350);
  local_180 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_178 = "";
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_180,0x22e);
  local_340 = (undefined **)CONCAT44(local_340._4_4_,3);
  iVar8 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&this->_M_h,(key_type *)&local_340);
  if (iVar8.
      super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>_>,_false>
      ._M_cur != (__node_type *)0x0) {
    local_360._0_1_ =
         *(long *)((long)iVar8.
                         super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>_>,_false>
                         ._M_cur + 0x30) !=
         (long)iVar8.
               super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>_>,_false>
               ._M_cur + 0x30 &&
         *(long *)((long)iVar8.
                         super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>_>,_false>
                         ._M_cur + 0x30) != 0;
    local_358 = 0;
    sStack_350.pi_ = (sp_counted_base *)0x0;
    local_308 = (undefined **)0x202d5f;
    local_300 = "";
    local_338 = 0;
    local_340 = &PTR__lazy_ostream_00242248;
    local_330 = &boost::unit_test::lazy_ostream::inst;
    local_1a0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
    ;
    local_198 = "";
    local_328 = (pair<unsigned_int,_unsigned_int> *)&local_308;
    boost::test_tools::tt_detail::report_assertion();
    boost::detail::shared_count::~shared_count(&sStack_350);
    local_1b0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
    ;
    local_1a8 = "";
    local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1b0,0x22f);
    local_340 = (undefined **)CONCAT44(local_340._4_4_,4);
    iVar8 = std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&this->_M_h,(key_type *)&local_340);
    if (iVar8.
        super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>_>,_false>
        ._M_cur == (__node_type *)0x0) {
      std::__throw_out_of_range("_Map_base::at");
    }
    local_360 = (undefined **)
                CONCAT71(local_360._1_7_,
                         *(long *)((long)iVar8.
                                         super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>_>,_false>
                                         ._M_cur + 0x30) !=
                         (long)iVar8.
                               super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>_>,_false>
                               ._M_cur + 0x30 &&
                         *(long *)((long)iVar8.
                                         super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>_>,_false>
                                         ._M_cur + 0x30) != 0);
    local_358 = 0;
    sStack_350.pi_ = (sp_counted_base *)0x0;
    local_308 = (undefined **)0x202d75;
    local_300 = "";
    local_338 = 0;
    local_340 = &PTR__lazy_ostream_00242248;
    local_330 = &boost::unit_test::lazy_ostream::inst;
    local_1d0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
    ;
    local_1c8 = "";
    local_328 = (pair<unsigned_int,_unsigned_int> *)&local_308;
    boost::test_tools::tt_detail::report_assertion(&local_360,&local_340,&local_1d0,0x22f,1,0,0);
    boost::detail::shared_count::~shared_count(&sStack_350);
    local_1e0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
    ;
    local_1d8 = "";
    local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1e0,0x231);
    pMVar4 = local_310;
    local_300 = (char *)((ulong)local_300 & 0xffffffffffffff00);
    local_308 = &PTR__lazy_ostream_00242048;
    local_2f8 = &boost::unit_test::lazy_ostream::inst;
    local_2f0 = "";
    local_364 = (int)(local_310->matrix_).matrix_._M_h._M_element_count;
    local_318 = (pair<unsigned_int,_unsigned_int>)&local_364;
    local_320 = &local_368;
    local_2e8[0] = local_364 == 5;
    local_368 = 5;
    local_2e0 = 0;
    sStack_2d8.pi_ = (sp_counted_base *)0x0;
    local_338 = 0;
    local_358 = local_358 & 0xffffffffffffff00;
    local_288 = (undefined4 **)0x1fb554;
    local_280 = "";
    local_340 = &PTR__lazy_ostream_00241fb8;
    local_330 = &boost::unit_test::lazy_ostream::inst;
    local_328 = &local_318;
    local_360 = &PTR__lazy_ostream_00242008;
    sStack_350.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
    local_348 = (undefined4 ***)&local_320;
    boost::test_tools::tt_detail::report_assertion();
    boost::detail::shared_count::~shared_count(&sStack_2d8);
    if ((pMVar4->colSettings_->operators).characteristic_ == 0xffffffff) {
      plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error
                (plVar9,
                 "Matrix::insert_boundary - Columns cannot be initialized if the coefficient field characteristic is not specified."
                );
    }
    else {
      IVar1 = (pMVar4->matrix_).nextIndex_;
      uVar13 = 0;
      if (boundary1.
          super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          boundary1.
          super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        uVar13 = (int)((ulong)((long)boundary1.
                                     super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)boundary1.
                                    super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 3) - 1;
      }
      this_00 = &pMVar4->matrix_;
      Gudhi::persistence_matrix::Matrix_all_dimension_holder<int>::update_up
                (&this_00->super_Matrix_dimension_option,uVar13);
      Gudhi::persistence_matrix::
      Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>>
      ::
      _reduce_boundary<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
                (&local_260,
                 (Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>>
                  *)this_00,IVar1,&boundary1,-1);
      if (local_260.
          super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_260.
                        super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_260.
                              super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_260.
                              super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      local_200 = 
      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
      ;
      local_1f8 = "";
      local_210 = &boost::unit_test::basic_cstring<char_const>::null;
      local_208 = &boost::unit_test::basic_cstring<char_const>::null;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_200,0x233);
      pMVar4 = local_310;
      local_300 = (char *)((ulong)local_300 & 0xffffffffffffff00);
      local_308 = &PTR__lazy_ostream_00242048;
      local_2f8 = &boost::unit_test::lazy_ostream::inst;
      local_2f0 = "";
      local_364 = (int)(local_310->matrix_).matrix_._M_h._M_element_count;
      local_2e8[0] = local_364 == 6;
      local_368 = 6;
      local_2e0 = 0;
      sStack_2d8.pi_ = (sp_counted_base *)0x0;
      local_338 = 0;
      local_358 = local_358 & 0xffffffffffffff00;
      local_288 = (undefined4 **)0x1fb554;
      local_280 = "";
      local_318 = (pair<unsigned_int,_unsigned_int>)&local_364;
      local_340 = &PTR__lazy_ostream_00241fb8;
      local_330 = &boost::unit_test::lazy_ostream::inst;
      local_328 = &local_318;
      local_320 = &local_368;
      local_360 = &PTR__lazy_ostream_00242008;
      sStack_350.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
      local_348 = (undefined4 ***)&local_320;
      boost::test_tools::tt_detail::report_assertion();
      boost::detail::shared_count::~shared_count(&sStack_2d8);
      if ((pMVar4->colSettings_->operators).characteristic_ != 0xffffffff) {
        IVar1 = (pMVar4->matrix_).nextIndex_;
        uVar13 = 0;
        if (boundary2.
            super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            boundary2.
            super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          uVar13 = (int)((ulong)((long)boundary2.
                                       super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)boundary2.
                                      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 3) - 1;
        }
        Gudhi::persistence_matrix::Matrix_all_dimension_holder<int>::update_up
                  (&this_00->super_Matrix_dimension_option,uVar13);
        Gudhi::persistence_matrix::
        Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>>
        ::
        _reduce_boundary<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
                  (&local_278,
                   (Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>>
                    *)this_00,IVar1,&boundary2,-1);
        if (local_278.
            super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_278.
                          super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_278.
                                super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_278.
                                super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        local_220 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
        ;
        local_218 = "";
        local_230 = &boost::unit_test::basic_cstring<char_const>::null;
        local_228 = &boost::unit_test::basic_cstring<char_const>::null;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_220,0x235);
        pMVar4 = local_310;
        local_300 = (char *)((ulong)local_300 & 0xffffffffffffff00);
        local_308 = &PTR__lazy_ostream_00242048;
        local_2f8 = &boost::unit_test::lazy_ostream::inst;
        local_2f0 = "";
        local_364 = (int)(local_310->matrix_).matrix_._M_h._M_element_count;
        local_2e8[0] = local_364 == 7;
        local_368 = 7;
        local_2e0 = 0;
        sStack_2d8.pi_ = (sp_counted_base *)0x0;
        local_288 = (undefined4 **)0x1fb554;
        local_280 = "";
        local_318 = (pair<unsigned_int,_unsigned_int>)&local_364;
        local_338 = 0;
        local_340 = &PTR__lazy_ostream_00241fb8;
        local_330 = &boost::unit_test::lazy_ostream::inst;
        local_328 = &local_318;
        local_320 = &local_368;
        local_358 = local_358 & 0xffffffffffffff00;
        local_360 = &PTR__lazy_ostream_00242008;
        sStack_350.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
        local_348 = (undefined4 ***)&local_320;
        boost::test_tools::tt_detail::report_assertion();
        boost::detail::shared_count::~shared_count(&sStack_2d8);
        test_chain_boundary_insertion<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>
        ::anon_class_1_0_00000001::operator()(&test,pMVar4);
        if (boundary1.
            super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(boundary1.
                          super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)boundary1.
                                super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)boundary1.
                                super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (boundary2.
            super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(boundary2.
                          super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)boundary2.
                                super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)boundary2.
                                super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        std::
        vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
        ::~vector(&orderedBoundaries);
        return;
      }
      plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error
                (plVar9,
                 "Matrix::insert_boundary - Columns cannot be initialized if the coefficient field characteristic is not specified."
                );
    }
    __cxa_throw(plVar9,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  std::__throw_out_of_range("_Map_base::at");
}

Assistant:

void test_chain_boundary_insertion(Matrix& m1, Matrix& m2) {
  auto test = [](Matrix& m) {
    BOOST_CHECK(m.is_zero_entry(1, 2));
    BOOST_CHECK(!m.is_zero_entry(1, 1));
    BOOST_CHECK(!m.is_zero_entry(3, 3));
    BOOST_CHECK(!m.is_zero_column(0));
    BOOST_CHECK(!m.is_zero_column(1));
    BOOST_CHECK(!m.is_zero_column(2));
    BOOST_CHECK(!m.is_zero_column(3));
    BOOST_CHECK(!m.is_zero_column(4));
    BOOST_CHECK(!m.is_zero_column(5));
    BOOST_CHECK(!m.is_zero_column(6));

    BOOST_CHECK_EQUAL(m.get_column_dimension(0), 0);
    BOOST_CHECK_EQUAL(m.get_column_dimension(1), 0);
    BOOST_CHECK_EQUAL(m.get_column_dimension(2), 0);
    BOOST_CHECK_EQUAL(m.get_column_dimension(3), 1);
    BOOST_CHECK_EQUAL(m.get_column_dimension(4), 1);
    BOOST_CHECK_EQUAL(m.get_column_dimension(5), 1);
    BOOST_CHECK_EQUAL(m.get_column_dimension(6), 2);

    BOOST_CHECK_EQUAL(m.get_pivot(0), 0);
    BOOST_CHECK_EQUAL(m.get_pivot(1), 1);
    BOOST_CHECK_EQUAL(m.get_pivot(2), 2);
    BOOST_CHECK_EQUAL(m.get_pivot(3), 3);
    BOOST_CHECK_EQUAL(m.get_pivot(4), 4);
    BOOST_CHECK_EQUAL(m.get_pivot(5), 5);
    BOOST_CHECK_EQUAL(m.get_pivot(6), 6);

    BOOST_CHECK_EQUAL(m.get_column_with_pivot(0), 0);
    BOOST_CHECK_EQUAL(m.get_column_with_pivot(1), 1);
    BOOST_CHECK_EQUAL(m.get_column_with_pivot(2), 2);
    BOOST_CHECK_EQUAL(m.get_column_with_pivot(3), 3);
    BOOST_CHECK_EQUAL(m.get_column_with_pivot(4), 4);
    BOOST_CHECK_EQUAL(m.get_column_with_pivot(5), 5);
    BOOST_CHECK_EQUAL(m.get_column_with_pivot(6), 6);
  };

  auto orderedBoundaries = build_simple_boundary_matrix<typename Matrix::Column>();

  for (unsigned int i = 0; i < orderedBoundaries.size(); ++i) {
    if constexpr (is_indexed_by_position<Matrix>())
      m1.insert_boundary(orderedBoundaries[i]);
    else
      m1.insert_boundary(i, orderedBoundaries[i]);
  }
  BOOST_CHECK_EQUAL(m1.get_number_of_columns(), 7);
  test(m1);

  auto boundary2 = orderedBoundaries.back();
  orderedBoundaries.pop_back();
  auto boundary1 = orderedBoundaries.back();
  orderedBoundaries.pop_back();

  BOOST_CHECK(m2.is_zero_entry(1, 2));
  BOOST_CHECK(!m2.is_zero_entry(1, 1));
  BOOST_CHECK(!m2.is_zero_entry(3, 3));
  BOOST_CHECK(!m2.is_zero_column(0));
  BOOST_CHECK(!m2.is_zero_column(1));
  BOOST_CHECK(!m2.is_zero_column(2));
  BOOST_CHECK(!m2.is_zero_column(3));
  BOOST_CHECK(!m2.is_zero_column(4));

  BOOST_CHECK_EQUAL(m2.get_number_of_columns(), 5);
  m2.insert_boundary(boundary1);
  BOOST_CHECK_EQUAL(m2.get_number_of_columns(), 6);
  m2.insert_boundary(boundary2);
  BOOST_CHECK_EQUAL(m2.get_number_of_columns(), 7);
  test(m2);
}